

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O2

bool SourceMap::Find(LPCSTR path,size_t pathLength,AutoString **out)

{
  AutoString *pAVar1;
  int iVar2;
  FileNode **ppFVar3;
  
  ppFVar3 = &root;
  do {
    pAVar1 = (AutoString *)((AutoString *)ppFVar3)->length;
    if (pAVar1 == (AutoString *)0x0) {
LAB_0010d323:
      return pAVar1 != (AutoString *)0x0;
    }
    iVar2 = strncmp(pAVar1[1].data,path,pathLength);
    if (iVar2 == 0) {
      *out = pAVar1;
      goto LAB_0010d323;
    }
    ppFVar3 = (FileNode **)(pAVar1 + 2);
  } while( true );
}

Assistant:

static bool Find(LPCSTR path, size_t pathLength, AutoString ** out)
    {
        FileNode * node = root;
        while(node != nullptr)
        {
            if (strncmp(node->path.GetString(), path, pathLength) == 0)
            {
                *out = &(node->data);
                return true;
            }
            node = node->next;
        }
        return false;
    }